

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O2

RC __thiscall
QL_Manager::InsertIntoRelation
          (QL_Manager *this,char *relName,int tupleLength,int nValues,Value *values)

{
  RC RVar1;
  DataAttrInfo *attributes;
  char *recbuf;
  QL_Manager *this_00;
  RID recRID;
  Printer printer;
  RM_FileHandle relFH;
  RID local_b8;
  RID local_b0;
  Value *local_a8;
  Printer local_a0;
  RM_FileHandle local_78;
  
  local_a8 = values;
  attributes = (DataAttrInfo *)malloc((long)this->relEntries->attrCount * 0x44);
  SetUpPrinterInsert(this,attributes);
  Printer::Printer(&local_a0,attributes,this->relEntries->attrCount);
  Printer::PrintHeader(&local_a0,(ostream *)&std::cout);
  RM_FileHandle::RM_FileHandle(&local_78);
  RVar1 = RM_Manager::OpenFile(this->rmm,relName,&local_78);
  if (RVar1 != 0) goto LAB_0010dab6;
  this_00 = (QL_Manager *)(long)tupleLength;
  recbuf = (char *)malloc((size_t)this_00);
  CreateRecord(this_00,recbuf,this->attrEntries,nValues,local_a8);
  RID::RID(&local_b8);
  RVar1 = RM_FileHandle::InsertRec(&local_78,recbuf,&local_b8);
  if (RVar1 == 0) {
    Printer::Print(&local_a0,(ostream *)&std::cout,recbuf);
    local_b0 = local_b8;
    RVar1 = InsertIntoIndex(this,recbuf,&local_b0);
    RID::~RID(&local_b0);
    if (RVar1 != 0) goto LAB_0010daa6;
    Printer::PrintFooter(&local_a0,(ostream *)&std::cout);
    free(recbuf);
    free(attributes);
    RVar1 = RM_Manager::CloseFile(this->rmm,&local_78);
  }
  else {
LAB_0010daa6:
    free(recbuf);
  }
  RID::~RID(&local_b8);
LAB_0010dab6:
  RM_FileHandle::~RM_FileHandle(&local_78);
  Printer::~Printer(&local_a0);
  return RVar1;
}

Assistant:

RC QL_Manager::InsertIntoRelation(const char *relName, int tupleLength, int nValues, const Value values[]){
  // Open relation
  RC rc = 0;
  
  // Creates the attribute setup for printing
  DataAttrInfo * printAttributes = (DataAttrInfo *)malloc(relEntries->attrCount* sizeof(DataAttrInfo));
  if((rc = SetUpPrinterInsert(printAttributes)))
    return (rc);
  Printer printer(printAttributes, relEntries->attrCount);
  printer.PrintHeader(cout);

  // Open the appropriate file
  RM_FileHandle relFH;
  if((rc = rmm.OpenFile(relName, relFH))){
    return (rc);
  }
  char *recbuf = (char *)malloc(tupleLength);

  // Create record
  CreateRecord(recbuf, attrEntries, nValues, values);

  // Insert into relation
  RID recRID;
  if((rc = relFH.InsertRec(recbuf, recRID))){
    free(recbuf);
    return (rc);
  }
  printer.Print(cout, recbuf);
  // Insert into any indices in the relation
  if((rc = InsertIntoIndex(recbuf, recRID))){
    free(recbuf);
    return (rc);
  }

  printer.PrintFooter(cout);
  free(recbuf);
  free(printAttributes);
  // Close relation, clean up
  rc = rmm.CloseFile(relFH);
  return (rc);

}